

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server.cpp
# Opt level: O2

void getBytes(istream *stream,size_t count,string *out)

{
  bool bVar1;
  
  while ((bVar1 = count != 0, count = count - 1, bVar1 &&
         (*(int *)(stream + *(long *)(*(long *)stream + -0x18) + 0x20) == 0))) {
    std::istream::get();
    std::__cxx11::string::push_back((char)out);
  }
  return;
}

Assistant:

void getBytes( istream& stream, const size_t count, string& out ){
    for( size_t i = 0; i < count && stream.good(); ++i ){
        out += (char)stream.get();
    }
}